

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O0

int write_to_temp(archive_write *a,void *buff,size_t s)

{
  long lVar1;
  ssize_t sVar2;
  uint *puVar3;
  size_t in_RDX;
  void *in_RSI;
  archive *in_RDI;
  uchar *b;
  ssize_t written;
  iso9660_conflict *iso9660;
  void *local_38;
  size_t local_20;
  
  lVar1 = *(long *)&in_RDI[1].current_codepage;
  local_38 = in_RSI;
  local_20 = in_RDX;
  while( true ) {
    if (local_20 == 0) {
      return 0;
    }
    sVar2 = write(*(int *)(lVar1 + 8),local_38,local_20);
    if (sVar2 < 0) break;
    local_20 = local_20 - sVar2;
    local_38 = (void *)(sVar2 + (long)local_38);
  }
  puVar3 = (uint *)__errno_location();
  archive_set_error(in_RDI,(int)(ulong)*puVar3,"Can\'t write to temporary file");
  return -0x1e;
}

Assistant:

static int
write_to_temp(struct archive_write *a, const void *buff, size_t s)
{
	struct _7zip *zip;
	const unsigned char *p;
	ssize_t ws;

	zip = (struct _7zip *)a->format_data;

	/*
	 * Open a temporary file.
	 */
	if (zip->temp_fd == -1) {
		zip->temp_offset = 0;
		zip->temp_fd = __archive_mktemp(NULL);
		if (zip->temp_fd < 0) {
			archive_set_error(&a->archive, errno,
			    "Couldn't create temporary file");
			return (ARCHIVE_FATAL);
		}
	}

	p = (const unsigned char *)buff;
	while (s) {
		ws = write(zip->temp_fd, p, s);
		if (ws < 0) {
			archive_set_error(&(a->archive), errno,
			    "fwrite function failed");
			return (ARCHIVE_FATAL);
		}
		s -= ws;
		p += ws;
		zip->temp_offset += ws;
	}
	return (ARCHIVE_OK);
}